

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O0

void __thiscall Hpipe::BranchSet::BranchSet(BranchSet *this,Vec<Hpipe::BranchSet::Range> *ranges)

{
  iterator iVar1;
  iterator iVar2;
  Node *pNVar3;
  Vec<Hpipe::BranchSet::Range> *ranges_local;
  BranchSet *this_local;
  
  AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::AutoPtr(&this->root);
  iVar1 = std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::begin
                    (&ranges->
                      super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    );
  iVar2 = std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::end
                    (&ranges->
                      super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    );
  std::
  sort<__gnu_cxx::__normal_iterator<Hpipe::BranchSet::Range*,std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>>,Hpipe::BranchSet::__normal_iterator(Hpipe::Vec<Hpipe::BranchSet::Range>)::__0>
            (iVar1._M_current,iVar2._M_current);
  pNVar3 = make_choice(this,ranges);
  AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator=(&this->root,pNVar3);
  pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&this->root);
  anon_unknown_5::cost_and_freq(pNVar3,0.0);
  return;
}

Assistant:

BranchSet::BranchSet( Vec<Range> ranges ) {
    std::sort( ranges.begin(), ranges.end(), []( const Range &a, const Range &b ) {
        return a.beg < b.beg;
    } );

    root = make_choice( ranges );
    cost_and_freq( root.ptr(), 0 );
}